

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_mqdec.c
# Opt level: O0

int jpc_mqdec_lpsexchrenormd(jpc_mqdec_t *mqdec)

{
  uchar uVar1;
  jpc_mqstate_t *pjVar2;
  byte *pbVar3;
  int iVar4;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_34;
  uchar prevbuf;
  int c;
  jpc_mqstate_t *state_2;
  jpc_mqstate_t *state_1;
  jpc_mqstate_t *state;
  int ret;
  jpc_mqdec_t *mqdec_local;
  
  if (mqdec->areg < (*mqdec->curctx)->qeval) {
    pjVar2 = *mqdec->curctx;
    mqdec->areg = pjVar2->qeval;
    state._4_4_ = (uint)(pjVar2->mps & 1);
    *mqdec->curctx = pjVar2->nmps;
  }
  else {
    pjVar2 = *mqdec->curctx;
    mqdec->areg = pjVar2->qeval;
    state._4_4_ = pjVar2->mps & 1 ^ 1;
    *mqdec->curctx = pjVar2->nlps;
  }
  do {
    if (mqdec->ctreg == 0) {
      if (mqdec->eof == 0) {
        if ((mqdec->in->flags_ & 7U) == 0) {
          if ((mqdec->in->rwlimit_ < 0) || (mqdec->in->rwcnt_ < mqdec->in->rwlimit_)) {
            iVar4 = mqdec->in->cnt_ + -1;
            mqdec->in->cnt_ = iVar4;
            if (iVar4 < 0) {
              local_40 = jas_stream_fillbuf(mqdec->in,1);
            }
            else {
              mqdec->in->rwcnt_ = mqdec->in->rwcnt_ + 1;
              pbVar3 = mqdec->in->ptr_;
              mqdec->in->ptr_ = pbVar3 + 1;
              local_40 = (uint)*pbVar3;
            }
            local_3c = local_40;
          }
          else {
            mqdec->in->flags_ = mqdec->in->flags_ | 4;
            local_3c = 0xffffffff;
          }
          local_44 = local_3c;
        }
        else {
          local_44 = 0xffffffff;
        }
        local_34 = local_44;
        if (local_44 == 0xffffffff) {
          mqdec->eof = 1;
          local_34 = 0xff;
        }
        uVar1 = mqdec->inbuffer;
        mqdec->inbuffer = (uchar)local_34;
        if (uVar1 == 0xff) {
          if ((int)local_34 < 0x90) {
            mqdec->creg = (long)(int)(local_34 << 9) + mqdec->creg;
            mqdec->ctreg = 7;
          }
          else {
            mqdec->creg = mqdec->creg + 0xff00;
            mqdec->ctreg = 8;
          }
        }
        else {
          mqdec->creg = (long)(int)(local_34 << 8) + mqdec->creg;
          mqdec->ctreg = 8;
        }
      }
      else {
        mqdec->creg = mqdec->creg + 0xff00;
        mqdec->ctreg = 8;
      }
    }
    mqdec->areg = mqdec->areg << 1;
    mqdec->creg = mqdec->creg << 1;
    mqdec->ctreg = mqdec->ctreg - 1;
  } while ((mqdec->areg & 0x8000) == 0);
  return state._4_4_;
}

Assistant:

int jpc_mqdec_lpsexchrenormd(register jpc_mqdec_t *mqdec)
{
	int ret;
	register const jpc_mqstate_t *state = *mqdec->curctx;
	jpc_mqdec_lpsexchange(mqdec->areg, state->qeval, mqdec->curctx, ret);
	jpc_mqdec_renormd(mqdec->areg, mqdec->creg, mqdec->ctreg, mqdec->in,
	  mqdec->eof, mqdec->inbuffer);
	return ret;
}